

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O0

bool Fossilize::add_application_filters
               (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>_>
                *output,Value *filters)

{
  bool bVar1;
  Pointer pVVar2;
  Type pGVar3;
  Ch *pCVar4;
  mapped_type *this;
  allocator local_b9;
  key_type local_b8;
  int local_94;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *local_90;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *value;
  AppInfo info;
  GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_28;
  ConstMemberIterator itr;
  Value *filters_local;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>_>
  *output_local;
  
  itr.ptr_ = (Pointer)filters;
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsObject(filters);
  if (bVar1) {
    local_28.ptr_ =
         (Pointer)rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::MemberBegin(&(itr.ptr_)->name);
    while( true ) {
      info.variant_dependencies_feature.
      super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::MemberEnd(&(itr.ptr_)->name);
      bVar1 = rapidjson::
              GenericMemberIterator<true,rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator!=((GenericMemberIterator<true,rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            *)&local_28,
                           (GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)&info.variant_dependencies_feature.
                               super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) break;
      pVVar2 = rapidjson::
               GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::operator->(&local_28);
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsObject(&pVVar2->value);
      if (!bVar1) {
        fprintf(_stderr,"Fossilize ERROR: Not an object.\n");
        output_local._7_1_ = 0;
        goto LAB_00204e31;
      }
      AppInfo::AppInfo((AppInfo *)&value);
      pVVar2 = rapidjson::
               GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::operator->(&local_28);
      local_90 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  *)&pVVar2->value;
      value._0_4_ = default_get_member_uint((Value *)local_90,"minimumApiVersion",0);
      info.minimum_api_version = default_get_member_uint((Value *)local_90,"minimumEngineVersion",0)
      ;
      value._4_4_ = default_get_member_uint((Value *)local_90,"minimumApplicationVersion",0);
      info.minimum_application_version._0_1_ =
           default_get_member_bool((Value *)local_90,"recordImmutableSamplers",true);
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)local_90,"blacklistedEnvironments");
      if (bVar1) {
        pGVar3 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>(local_90,"blacklistedEnvironments");
        bVar1 = parse_blacklist_environments
                          (pGVar3,(vector<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_> *
                                  )&info.minimum_engine_version);
        if (bVar1) goto LAB_00204cd2;
        output_local._7_1_ = 0;
        local_94 = 1;
      }
      else {
LAB_00204cd2:
        bVar1 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)local_90,"bucketVariantDependencies");
        if (bVar1) {
          pGVar3 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>(local_90,"bucketVariantDependencies");
          bVar1 = parse_bucket_variant_dependencies
                            (pGVar3,(vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                                     *)&info.env_infos.
                                        super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (!bVar1) {
            output_local._7_1_ = 0;
            local_94 = 1;
            goto LAB_00204e06;
          }
        }
        bVar1 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)local_90,"bucketVariantFeatureDependencies");
        if (bVar1) {
          pGVar3 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>(local_90,"bucketVariantFeatureDependencies");
          bVar1 = parse_bucket_variant_dependencies
                            (pGVar3,(vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                                     *)&info.variant_dependencies.
                                        super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (!bVar1) {
            output_local._7_1_ = 0;
            local_94 = 1;
            goto LAB_00204e06;
          }
        }
        pVVar2 = rapidjson::
                 GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::operator->(&local_28);
        pCVar4 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetString(&pVVar2->name);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_b8,pCVar4,&local_b9);
        this = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>_>
               ::operator[](output,&local_b8);
        AppInfo::operator=(this,(AppInfo *)&value);
        std::__cxx11::string::~string((string *)&local_b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_b9);
        local_94 = 0;
      }
LAB_00204e06:
      AppInfo::~AppInfo((AppInfo *)&value);
      if (local_94 != 0) goto LAB_00204e31;
      rapidjson::
      GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::operator++(&local_28);
    }
    output_local._7_1_ = 1;
  }
  else {
    fprintf(_stderr,"Fossilize ERROR: Not an object.\n");
    output_local._7_1_ = 0;
  }
LAB_00204e31:
  return (bool)(output_local._7_1_ & 1);
}

Assistant:

static bool add_application_filters(std::unordered_map<std::string, AppInfo> &output, const Value *filters)
{
	if (!filters->IsObject())
	{
		LOGE("Not an object.\n");
		return false;
	}

	for (auto itr = filters->MemberBegin(); itr != filters->MemberEnd(); ++itr)
	{
		if (!itr->value.IsObject())
		{
			LOGE("Not an object.\n");
			return false;
		}

		AppInfo info;

		auto &value = itr->value;
		info.minimum_api_version = default_get_member_uint(value, "minimumApiVersion");
		info.minimum_engine_version = default_get_member_uint(value, "minimumEngineVersion");
		info.minimum_application_version = default_get_member_uint(value, "minimumApplicationVersion");
		info.record_immutable_samplers = default_get_member_bool(value, "recordImmutableSamplers", true);
		if (value.HasMember("blacklistedEnvironments"))
			if (!parse_blacklist_environments(value["blacklistedEnvironments"], info.env_infos))
				return false;
		if (value.HasMember("bucketVariantDependencies"))
			if (!parse_bucket_variant_dependencies(value["bucketVariantDependencies"], info.variant_dependencies))
				return false;
		if (value.HasMember("bucketVariantFeatureDependencies"))
			if (!parse_bucket_variant_dependencies(value["bucketVariantFeatureDependencies"], info.variant_dependencies_feature))
				return false;
		output[itr->name.GetString()] = std::move(info);
	}

	return true;
}